

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void import_kernel_nv(char *name,int in_qemu)

{
  int iVar1;
  char *pcVar2;
  char *value_00;
  int in_ESI;
  char *in_RDI;
  char *value;
  undefined4 in_stack_fffffffffffffff0;
  
  pcVar2 = strchr(in_RDI,0x3d);
  if (pcVar2 != (char *)0x0) {
    value_00 = pcVar2 + 1;
    *pcVar2 = '\0';
    if ((*in_RDI != '\0') && (in_ESI == 0)) {
      iVar1 = strcmp(in_RDI,"qemu");
      if (iVar1 == 0) {
        strlcpy(qemu,value_00,0x20);
      }
      else {
        iVar1 = strcmp(in_RDI,"androidboot.console");
        if (iVar1 == 0) {
          strlcpy(console,value_00,0x20);
        }
        else {
          iVar1 = strcmp(in_RDI,"androidboot.mode");
          if (iVar1 == 0) {
            strlcpy(bootmode,value_00,0x20);
          }
          else {
            qemu_cmdline((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),value_00);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void import_kernel_nv(char *name, int in_qemu)
{
    char *value = strchr(name, '=');

    if (value == 0) return;
    *value++ = 0;
    if (*name == 0) return;

    if (!in_qemu)
    {
        /* on a real device, white-list the kernel options */
        if (!strcmp(name,"qemu")) {
            strlcpy(qemu, value, sizeof(qemu));
        } else if (!strcmp(name,"androidboot.console")) {
            strlcpy(console, value, sizeof(console));
        } else if (!strcmp(name,"androidboot.mode")) {
            strlcpy(bootmode, value, sizeof(bootmode));
        } else {
            qemu_cmdline(name, value);
        }
    }
   
}